

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgrayraster.c
# Opt level: O0

int gray_raster_new(QT_FT_Raster *araster)

{
  void *pvVar1;
  long *in_RDI;
  undefined4 local_4;
  
  pvVar1 = malloc(0x30);
  *in_RDI = (long)pvVar1;
  if (*in_RDI == 0) {
    *in_RDI = 0;
    local_4 = -4;
  }
  else {
    memset((void *)*in_RDI,0,0x30);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
  gray_raster_new( QT_FT_Raster*  araster )
  {
    *araster = malloc(sizeof(TRaster));
    if (!*araster) {
        *araster = 0;
        return ErrRaster_Memory_Overflow;
    }
    QT_FT_MEM_ZERO(*araster, sizeof(TRaster));

    return 0;
  }